

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O2

void __thiscall HMatrix::compute_vecT_matB(HMatrix *this,double *vec,int *base,HVector *result)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  double dVar8;
  
  HVector::clear(result);
  piVar2 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = 0;
  for (lVar5 = 0; lVar5 < this->numRow; lVar5 = lVar5 + 1) {
    iVar1 = base[lVar5];
    if (iVar1 < this->numCol) {
      dVar8 = 0.0;
      for (lVar7 = (long)piVar4[iVar1]; lVar7 < piVar4[(long)iVar1 + 1]; lVar7 = lVar7 + 1) {
        dVar8 = dVar8 + vec[(this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7]] *
                        (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7];
      }
    }
    else {
      dVar8 = vec[iVar1 - this->numCol];
    }
    if (1e-14 < ABS(dVar8)) {
      pdVar3[lVar5] = dVar8;
      lVar7 = (long)iVar6;
      iVar6 = iVar6 + 1;
      piVar2[lVar7] = (int)lVar5;
    }
  }
  result->count = iVar6;
  return;
}

Assistant:

void HMatrix::compute_vecT_matB(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];
    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = 0;
        if (iCol < numCol) {
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                value += vec[Aindex[k]] * Avalue[k];
        } else {
            value = vec[iCol - numCol];
        }
        if (fabs(value) > HSOL_CONST_TINY) {
            resultArray[i] = value;
            resultIndex[resultCount++] = i;
        }
    }
    result->count = resultCount;
}